

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void exchange_particle_slices
               (int send_left,int send_width,int receive_left,int receive_width,int rank,
               vector<int,_std::allocator<int>_> *particle_numbers,int pn_size,
               vector<particle,_std::allocator<particle>_> *particles,int x_diff)

{
  int iVar1;
  int particles_to_receive;
  int particles_to_send;
  int iVar2;
  
  particles_to_send = pack_particle_slice(send_left,send_width,particle_numbers,particles);
  particles_to_receive = 0;
  MPI_Sendrecv(&particles_to_send,1,&ompi_mpi_int,rank,0,&particles_to_receive,1,&ompi_mpi_int,rank,
               0,&ompi_mpi_comm_world,0);
  iVar2 = (int)((ulong)((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(particles->super__Vector_base<particle,_std::allocator<particle>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar1 = iVar2 * -0x3b13b13b;
  if (particles_to_receive != iVar1 &&
      SBORROW4(particles_to_receive,iVar1) == particles_to_receive + iVar2 * 0x3b13b13b < 0) {
    std::vector<particle,_std::allocator<particle>_>::resize
              (particles,(long)((particles_to_receive * 3) / 2 + 1));
  }
  MPI_Sendrecv_replace
            ((particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,pn_size,&ompi_mpi_int,rank,1,rank,1,
             &ompi_mpi_comm_world,0);
  iVar1 = particles_to_send;
  if (particles_to_send < particles_to_receive) {
    iVar1 = particles_to_receive;
  }
  MPI_Sendrecv_replace
            ((particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_start,iVar1,MPI_PARTICLE,rank,2,rank,2,&ompi_mpi_comm_world,
             0);
  unpack_particle_slice(receive_left,receive_width,particle_numbers,particles,x_diff);
  return;
}

Assistant:

void exchange_particle_slices(int send_left, int send_width, int receive_left, int receive_width, int rank,
        vector<int> & particle_numbers, int pn_size, vector<particle> & particles, int x_diff) {
    int particles_to_send = pack_particle_slice(send_left, send_width, particle_numbers, particles);
    int particles_to_receive = 0;

    MPI_Sendrecv(&particles_to_send, 1, MPI_INT, rank, 0, &particles_to_receive, 1, MPI_INT, rank, 0, MPI_COMM_WORLD,
            MPI_STATUS_IGNORE);

    if (particles_to_receive > static_cast<int>(particles.size())) {
        particles.resize(3 * particles_to_receive / 2 + 1);
    }

    MPI_Sendrecv_replace(&(particle_numbers[0]), pn_size, MPI_INT, rank, 1, rank, 1, MPI_COMM_WORLD,
    MPI_STATUSES_IGNORE);

    int particles_size = max(particles_to_receive, particles_to_send);

    MPI_Sendrecv_replace(&(particles[0]), particles_size, MPI_PARTICLE, rank, 2, rank, 2, MPI_COMM_WORLD,
            MPI_STATUS_IGNORE);

    unpack_particle_slice(receive_left, receive_width, particle_numbers, particles, x_diff);
}